

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::PromoteObjectSynchData
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,VOID *pvLocalSynchData,
          VOID **ppvSharedSynchData)

{
  PWaitingThreadsListNode p_Var1;
  _WaitingThreadsListNode *p_Var2;
  bool bVar3;
  ObjectDomain OVar4;
  ULONG n;
  PalObjectTypeId PVar5;
  LONG LVar6;
  ULONG UVar7;
  OwnershipSemantics OVar8;
  VOID *shmptr;
  CSynchData *this_00;
  CObjectType *this_01;
  CObjectType *pot_00;
  LPVOID pvVar9;
  OwnedObjectsListNode *pooln_00;
  CPalThread *pOwnerThread;
  WaitingThreadsListNode *pwtlnTemp;
  WaitingThreadsListNode *pwtln;
  MonitoredProcessesListNode *pmpn;
  OwnedObjectsListNode *pooln;
  int i_1;
  WaitingThreadsListNode *pwtlnNew;
  WaitingThreadsListNode *pwtlnOld;
  int i;
  ULONG ulcWaitingThreads;
  CObjectType *pot;
  SHMPTR *rgshridWTLNodes;
  SHMPTR shridSynchData;
  CSynchData *psdShared;
  CSynchData *psdLocal;
  PAL_ERROR palError;
  VOID **ppvSharedSynchData_local;
  VOID *pvLocalSynchData_local;
  CPalThread *pthrCurrent_local;
  CPalSynchronizationManager *this_local;
  
  psdLocal._4_4_ = 0;
  pot = (CObjectType *)0x0;
  if (pthrCurrent == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xd7c);
    fprintf(_stderr,"Expression: NULL != pthrCurrent\n");
  }
  if (pvLocalSynchData == (VOID *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xd7d);
    fprintf(_stderr,"Expression: NULL != pvLocalSynchData\n");
  }
  if (ppvSharedSynchData == (VOID **)0x0) {
    fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xd7e);
    fprintf(_stderr,"Expression: NULL != ppvSharedSynchData\n");
  }
  OVar4 = CSynchData::GetObjectDomain((CSynchData *)pvLocalSynchData);
  if (OVar4 != ProcessLocalObject) {
    fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xd7f);
    fprintf(_stderr,"Expression: ProcessLocalObject == psdLocal->GetObjectDomain()\n");
  }
  shmptr = (VOID *)CSHRSynchCache<CorUnix::CSynchData>::Get(&this->m_cacheSHRSynchData,pthrCurrent);
  if (shmptr == (VOID *)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    psdLocal._4_4_ = 8;
    goto LAB_0024e563;
  }
  this_00 = (CSynchData *)SHMPtrToPtr((SHMPTR)shmptr);
  if (this_00 == (CSynchData *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xd95);
    fprintf(_stderr,"Expression: NULL != psdShared\n");
  }
  n = CSynchData::GetWaitingThreadCount((CSynchData *)pvLocalSynchData);
  if (n != 0) {
    pot = (CObjectType *)InternalNewArray<unsigned_long>((ulong)n);
    if (pot == (CObjectType *)0x0) {
      psdLocal._4_4_ = 0xe;
      goto LAB_0024e563;
    }
    pwtlnOld._0_4_ =
         CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::Get
                   (&this->m_cacheSHRWTListNodes,pthrCurrent,n,(SHMPTR *)pot);
    if ((ULONG)pwtlnOld != n) {
      while (pwtlnOld._0_4_ = (ULONG)pwtlnOld - 1, -1 < (int)(ULONG)pwtlnOld) {
        CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::Add
                  (&this->m_cacheSHRWTListNodes,pthrCurrent,
                   *(SHMPTR *)(&pot->m_eTypeId + (long)(int)(ULONG)pwtlnOld * 2));
      }
      psdLocal._4_4_ = 0xe;
      goto LAB_0024e563;
    }
  }
  this_01 = CSynchData::GetObjectType((CSynchData *)pvLocalSynchData);
  if (this_01 == (CObjectType *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xdc0);
    fprintf(_stderr,"Expression: NULL != pot\n");
  }
  PVar5 = CObjectType::GetId(this_01);
  if (PVar5 == otiProcess) {
    InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  }
  CSynchData::SetSharedThis(this_00,(SHMPTR)shmptr);
  CSynchData::SetObjectDomain(this_00,SharedObject);
  pot_00 = CSynchData::GetObjectType((CSynchData *)pvLocalSynchData);
  CSynchData::SetObjectType(this_00,pot_00);
  LVar6 = CSynchData::GetSignalCount((CSynchData *)pvLocalSynchData);
  CSynchData::SetSignalCount(this_00,LVar6);
  CSynchData::SetWTLHeadShrPtr(this_00,0);
  CSynchData::SetWTLTailShrPtr(this_00,0);
  if (n != 0) {
    pooln._4_4_ = 0;
    pwtlnNew = CSynchData::GetWTLHeadPtr((CSynchData *)pvLocalSynchData);
    while (pwtlnNew != (WaitingThreadsListNode *)0x0) {
      pvVar9 = SHMPtrToPtr(*(SHMPTR *)(&pot->m_eTypeId + (long)pooln._4_4_ * 2));
      if (pvVar9 == (LPVOID)0x0) {
        fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0xded);
        fprintf(_stderr,"Expression: NULL != pwtlnNew\n");
      }
      *(undefined8 *)((long)pvVar9 + 0x10) =
           *(undefined8 *)(&pot->m_eTypeId + (long)pooln._4_4_ * 2);
      *(VOID **)((long)pvVar9 + 0x30) = shmptr;
      *(DWORD *)((long)pvVar9 + 0x18) = pwtlnNew->dwThreadId;
      *(DWORD *)((long)pvVar9 + 0x1c) = pwtlnNew->dwProcessId;
      *(DWORD *)((long)pvVar9 + 0x20) = pwtlnNew->dwObjIndex;
      *(DWORD *)((long)pvVar9 + 0x24) = pwtlnNew->dwFlags | 1;
      *(SHMPTR *)((long)pvVar9 + 0x28) = pwtlnNew->shridWaitingState;
      *(_ThreadWaitInfo **)((long)pvVar9 + 0x38) = pwtlnNew->ptwiWaitInfo;
      CSynchData::SharedWaiterEnqueue(this_00,*(SHMPTR *)(&pot->m_eTypeId + (long)pooln._4_4_ * 2));
      CSynchData::AddRef(this_00);
      p_Var1 = pwtlnNew->ptwiWaitInfo->rgpWTLNodes[pwtlnNew->dwObjIndex];
      if (p_Var1 == (PWaitingThreadsListNode)0x0) {
        fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0xdfc);
        fprintf(_stderr,
                "Expression: pwtlnOld = pwtlnOld->ptwiWaitInfo->rgpWTLNodes[pwtlnOld->dwObjIndex]\n"
               );
      }
      *(LPVOID *)(*(long *)((long)pvVar9 + 0x38) + 0x18 + (ulong)*(uint *)((long)pvVar9 + 0x20) * 8)
           = pvVar9;
      *(int *)(*(long *)((long)pvVar9 + 0x38) + 0xc) =
           *(int *)(*(long *)((long)pvVar9 + 0x38) + 0xc) + 1;
      if (*(int *)(*(long *)((long)pvVar9 + 0x38) + 0xc) ==
          *(int *)(*(long *)((long)pvVar9 + 0x38) + 8)) {
        *(undefined4 *)(*(long *)((long)pvVar9 + 0x38) + 4) = 2;
      }
      else {
        if (*(int *)(*(long *)((long)pvVar9 + 0x38) + 8) <=
            *(int *)(*(long *)((long)pvVar9 + 0x38) + 0xc)) {
          fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                  ,0xe08);
          fprintf(_stderr,
                  "Expression: pwtlnNew->ptwiWaitInfo->lSharedObjCount < pwtlnNew->ptwiWaitInfo->lObjCount\n"
                 );
        }
        *(undefined4 *)(*(long *)((long)pvVar9 + 0x38) + 4) = 1;
      }
      pooln._4_4_ = pooln._4_4_ + 1;
      pwtlnNew = (p_Var1->ptrNext).ptr;
    }
    UVar7 = CSynchData::GetWaitingThreadCount(this_00);
    if (UVar7 != n) {
      fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
              ,0xe0e);
      fprintf(_stderr,"Expression: psdShared->GetWaitingThreadCount() == ulcWaitingThreads\n");
    }
  }
  OVar8 = CObjectType::GetOwnershipSemantics(this_01);
  if (OVar8 == OwnershipTracked) {
    pooln_00 = CSynchData::GetOwnershipListNode((CSynchData *)pvLocalSynchData);
    if (pooln_00 == (OwnedObjectsListNode *)0x0) {
      LVar6 = CSynchData::GetOwnershipCount((CSynchData *)pvLocalSynchData);
      if (LVar6 != 0) {
        fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0xe2c);
        fprintf(_stderr,"Expression: 0 == psdLocal->GetOwnershipCount()\n");
      }
      LVar6 = CSynchData::GetOwnershipCount(this_00);
      if (LVar6 != 0) {
        fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0xe2d);
        fprintf(_stderr,"Expression: 0 == psdShared->GetOwnershipCount()\n");
      }
      bVar3 = CSynchData::IsAbandoned((CSynchData *)pvLocalSynchData);
      CSynchData::SetAbandoned(this_00,bVar3);
    }
    else {
      pooln_00->pPalObjSynchData = this_00;
      CSynchData::SetOwnershipListNode(this_00,pooln_00);
      CSynchData::AddRef(this_00);
      pOwnerThread = CSynchData::GetOwnerThread((CSynchData *)pvLocalSynchData);
      CSynchData::SetOwner(this_00,pOwnerThread);
      LVar6 = CSynchData::GetOwnershipCount((CSynchData *)pvLocalSynchData);
      CSynchData::SetOwnershipCount(this_00,LVar6);
      bVar3 = CSynchData::IsAbandoned(this_00);
      if (bVar3) {
        fprintf(_stderr,"] %s %s:%d","PromoteObjectSynchData",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0xe28);
        fprintf(_stderr,"Expression: !psdShared->IsAbandoned()\n");
      }
    }
  }
  PVar5 = CObjectType::GetId(this_01);
  if (PVar5 == otiProcess) {
    for (pwtln = (WaitingThreadsListNode *)this->m_pmplnMonitoredProcesses;
        pwtln != (WaitingThreadsListNode *)0x0; pwtln = (pwtln->ptrNext).ptr) {
      if (pvLocalSynchData == (VOID *)pwtln->shridSHRThis) {
        pwtln->shridSHRThis = (SHMPTR)this_00;
        CSynchData::AddRef(this_00);
      }
    }
    for (pwtln = (WaitingThreadsListNode *)this->m_pmplnExitedNodes;
        pwtln != (WaitingThreadsListNode *)0x0; pwtln = (pwtln->ptrNext).ptr) {
      if (pvLocalSynchData == (VOID *)pwtln->shridSHRThis) {
        pwtln->shridSHRThis = (SHMPTR)this_00;
        CSynchData::AddRef(this_00);
      }
    }
    InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  }
  *ppvSharedSynchData = shmptr;
  if (n != 0) {
    pwtlnTemp = CSynchData::GetWTLHeadPtr((CSynchData *)pvLocalSynchData);
    while (pwtlnTemp != (WaitingThreadsListNode *)0x0) {
      p_Var2 = (pwtlnTemp->ptrNext).ptr;
      CSynchCache<CorUnix::_WaitingThreadsListNode>::Add
                (&this->m_cacheWTListNodes,pthrCurrent,pwtlnTemp);
      pwtlnTemp = p_Var2;
    }
  }
  CSynchCache<CorUnix::CSynchData>::Add
            (&this->m_cacheSynchData,pthrCurrent,(CSynchData *)pvLocalSynchData);
LAB_0024e563:
  if (pot != (CObjectType *)0x0) {
    InternalDeleteArray<unsigned_long>((unsigned_long *)pot);
  }
  return psdLocal._4_4_;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::PromoteObjectSynchData(
        CPalThread *pthrCurrent,
        VOID *pvLocalSynchData,
        VOID **ppvSharedSynchData)
    {
        PAL_ERROR palError = NO_ERROR;
        CSynchData *psdLocal = reinterpret_cast<CSynchData *>(pvLocalSynchData);
        CSynchData *psdShared = NULL;
        SharedID shridSynchData = NULLSharedID;
        SharedID *rgshridWTLNodes = NULL;
        CObjectType *pot = NULL;
        ULONG ulcWaitingThreads;

        _ASSERTE(NULL != pthrCurrent);
        _ASSERTE(NULL != pvLocalSynchData);
        _ASSERTE(NULL != ppvSharedSynchData);
        _ASSERTE(ProcessLocalObject == psdLocal->GetObjectDomain());

#if _DEBUG

        //
        // TODO: Verify that the proper locks are held
        //
#endif

        //
        // Allocate shared memory CSynchData and map to local memory
        //

        shridSynchData = m_cacheSHRSynchData.Get(pthrCurrent);
        if (NULLSharedID == shridSynchData)
        {
            ERROR("Unable to allocate shared memory\n");
            palError = ERROR_NOT_ENOUGH_MEMORY;
            goto POSD_exit;
        }

        psdShared = SharedIDToTypePointer(CSynchData, shridSynchData);
        _ASSERTE(NULL != psdShared);

        //
        // Allocate shared memory WaitingThreadListNodes if there are
        // any threads currently waiting on this object
        //

        ulcWaitingThreads = psdLocal->GetWaitingThreadCount();
        if (0 < ulcWaitingThreads)
        {
            int i;

            rgshridWTLNodes = InternalNewArray<SharedID>(ulcWaitingThreads);
            if (NULL == rgshridWTLNodes)
            {
                palError = ERROR_OUTOFMEMORY;
                goto POSD_exit;
            }

            i = m_cacheSHRWTListNodes.Get(
                    pthrCurrent,
                    ulcWaitingThreads,
                    rgshridWTLNodes
                    );

            if (static_cast<ULONG>(i) != ulcWaitingThreads)
            {
                for (i -= 1; i >= 0; i -= 1)
                {
                    m_cacheSHRWTListNodes.Add(pthrCurrent, rgshridWTLNodes[i]);
                }

                palError = ERROR_OUTOFMEMORY;
                goto POSD_exit;
            }
        }

        //
        // If the synch data is for a process object we need to grab
        // the monitored process list lock here
        //

        pot = psdLocal->GetObjectType();
        _ASSERTE(NULL != pot);

        if (otiProcess == pot->GetId())
        {
            InternalEnterCriticalSection(pthrCurrent, &s_csMonitoredProcessesLock);
        }

        //
        // Copy pertinent CSynchData info to the shared memory version (and
        // initialize other members)
        //

        psdShared->SetSharedThis(shridSynchData);
        psdShared->SetObjectDomain(SharedObject);
        psdShared->SetObjectType(psdLocal->GetObjectType());
        psdShared->SetSignalCount(psdLocal->GetSignalCount());

#ifdef SYNCH_STATISTICS
        psdShared->SetStatContentionCount(psdLocal->GetStatContentionCount());
        psdShared->SetStatWaitCount(psdLocal->GetStatWaitCount());
#endif

        //
        // Rebuild the waiting thread list, and update the wait domain
        // for the waiting threads
        //

        psdShared->SetWTLHeadShrPtr(NULLSharedID);
        psdShared->SetWTLTailShrPtr(NULLSharedID);

        if (0 < ulcWaitingThreads)
        {
            WaitingThreadsListNode *pwtlnOld;
            WaitingThreadsListNode *pwtlnNew;
            int i = 0;

            for (pwtlnOld = psdLocal->GetWTLHeadPtr();
                 pwtlnOld != NULL;
                 pwtlnOld = pwtlnOld->ptrNext.ptr, i += 1)
            {
                pwtlnNew = SharedIDToTypePointer(
                    WaitingThreadsListNode,
                    rgshridWTLNodes[i]
                    );

                _ASSERTE(NULL != pwtlnNew);

                pwtlnNew->shridSHRThis = rgshridWTLNodes[i];
                pwtlnNew->ptrOwnerObjSynchData.shrid = shridSynchData;

                pwtlnNew->dwThreadId = pwtlnOld->dwThreadId;
                pwtlnNew->dwProcessId = pwtlnOld->dwProcessId;
                pwtlnNew->dwObjIndex = pwtlnOld->dwObjIndex;
                pwtlnNew->dwFlags = pwtlnOld->dwFlags | WTLN_FLAG_OWNER_OBJECT_IS_SHARED;
                pwtlnNew->shridWaitingState = pwtlnOld->shridWaitingState;
                pwtlnNew->ptwiWaitInfo = pwtlnOld->ptwiWaitInfo;

                psdShared->SharedWaiterEnqueue(rgshridWTLNodes[i]);
                psdShared->AddRef();

                _ASSERTE(pwtlnOld = pwtlnOld->ptwiWaitInfo->rgpWTLNodes[pwtlnOld->dwObjIndex]);
                pwtlnNew->ptwiWaitInfo->rgpWTLNodes[pwtlnNew->dwObjIndex] = pwtlnNew;

                pwtlnNew->ptwiWaitInfo->lSharedObjCount += 1;
                if (pwtlnNew->ptwiWaitInfo->lSharedObjCount
                    == pwtlnNew->ptwiWaitInfo->lObjCount)
                {
                    pwtlnNew->ptwiWaitInfo->wdWaitDomain = SharedWait;
                }
                else
                {
                    _ASSERTE(pwtlnNew->ptwiWaitInfo->lSharedObjCount
                        < pwtlnNew->ptwiWaitInfo->lObjCount);

                    pwtlnNew->ptwiWaitInfo->wdWaitDomain = MixedWait;
                }
            }

            _ASSERTE(psdShared->GetWaitingThreadCount() == ulcWaitingThreads);
        }

        //
        // If the object tracks ownership and has a current owner update
        // the OwnedObjectsListNode to point to the shared memory synch
        // data
        //

        if (CObjectType::OwnershipTracked == pot->GetOwnershipSemantics())
        {
            OwnedObjectsListNode *pooln;

            pooln = psdLocal->GetOwnershipListNode();
            if (NULL != pooln)
            {
                pooln->pPalObjSynchData = psdShared;
                psdShared->SetOwnershipListNode(pooln);
                psdShared->AddRef();

                //
                // Copy over other ownership info.
                //

                psdShared->SetOwner(psdLocal->GetOwnerThread());
                psdShared->SetOwnershipCount(psdLocal->GetOwnershipCount());
                _ASSERTE(!psdShared->IsAbandoned());
            }
            else
            {
                _ASSERTE(0 == psdLocal->GetOwnershipCount());
                _ASSERTE(0 == psdShared->GetOwnershipCount());
                psdShared->SetAbandoned(psdLocal->IsAbandoned());
            }
        }

        //
        // If the synch data is for a process object update the monitored
        // process list nodes to point to the shared memory object data,
        // and release the monitored process list lock
        //

        if (otiProcess == pot->GetId())
        {
            MonitoredProcessesListNode *pmpn;

            pmpn = m_pmplnMonitoredProcesses;
            while (NULL != pmpn)
            {
                if (psdLocal == pmpn->psdSynchData)
                {
                    pmpn->psdSynchData = psdShared;
                    psdShared->AddRef();
                }

                pmpn = pmpn->pNext;
            }

            pmpn = m_pmplnExitedNodes;
            while (NULL != pmpn)
            {
                if (psdLocal == pmpn->psdSynchData)
                {
                    pmpn->psdSynchData = psdShared;
                    psdShared->AddRef();
                }

                pmpn = pmpn->pNext;
            }

            InternalLeaveCriticalSection(pthrCurrent, &s_csMonitoredProcessesLock);
        }

        *ppvSharedSynchData = reinterpret_cast<VOID*>(shridSynchData);

        //
        // Free the local memory items to caches
        //

        if (0 < ulcWaitingThreads)
        {
            WaitingThreadsListNode *pwtln;

            pwtln = psdLocal->GetWTLHeadPtr();
            while (NULL != pwtln)
            {
                WaitingThreadsListNode *pwtlnTemp;

                pwtlnTemp = pwtln;
                pwtln = pwtln->ptrNext.ptr;
                m_cacheWTListNodes.Add(pthrCurrent, pwtlnTemp);
            }
        }

        m_cacheSynchData.Add(pthrCurrent, psdLocal);

    POSD_exit:

        if (NULL != rgshridWTLNodes)
        {
            InternalDeleteArray(rgshridWTLNodes);
        }

        return palError;
    }